

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstr.c
# Opt level: O3

uint8_t * bstr_to_long(uint8_t *pBegin,uint8_t *pEnd,long *data)

{
  size_t delta;
  long lVar1;
  size_t __n;
  char *parse_end;
  char tmp [33];
  char *local_60;
  char local_58 [40];
  
  local_60 = (char *)0x0;
  __n = 0x20;
  if ((ulong)((long)pEnd - (long)pBegin) < 0x20) {
    __n = (long)pEnd - (long)pBegin;
  }
  memcpy(local_58,pBegin,__n);
  local_58[__n] = '\0';
  lVar1 = strtol(local_58,&local_60,0);
  *data = lVar1;
  lVar1 = (long)local_60 - (long)local_58;
  if (local_60 < local_58 || lVar1 == 0) {
    if (lVar1 == 0) {
      return pBegin;
    }
  }
  else if (pBegin + lVar1 <= pEnd) {
    return pBegin + lVar1;
  }
  return (uint8_t *)0x0;
}

Assistant:

const uint8_t *bstr_to_long(const uint8_t *pBegin, const uint8_t *pEnd, long *data)
{
   char tmp[MAX_NUMBER_SIZE+1];   
   char* parse_end = NULL;
   size_t size = pEnd - pBegin;
   if (size > MAX_NUMBER_SIZE)
   {
      size = MAX_NUMBER_SIZE;
   }
   memcpy(&tmp[0], pBegin, size);
   tmp[size]='\0';
   *data = strtol(&tmp[0], &parse_end, 0);   
   if (parse_end > &tmp[0] )
   {
      size_t delta = parse_end - &tmp[0];
      const uint8_t* retval = pBegin + delta;
      if (retval <= pEnd)
      {
         return retval;
      }   
   }
   else if (parse_end == &tmp[0])
   {
      return pBegin; //Not a number
   }
   return NULL;
}